

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O1

void * ARKStepCreate(ARKRhsFn fe,ARKRhsFn fi,sunrealtype t0,N_Vector y0,SUNContext_conflict sunctx)

{
  undefined4 in_EAX;
  int iVar1;
  ARKodeMem ark_mem_00;
  undefined8 *__s;
  SUNNonlinearSolver NLS;
  int iVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  ARKodeMem ark_mem;
  ARKodeMem local_48;
  sunrealtype local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  auVar4._0_4_ = -(uint)((int)fe == 0);
  auVar4._4_4_ = -(uint)((int)((ulong)fe >> 0x20) == 0);
  auVar4._8_4_ = -(uint)((int)fi == 0);
  auVar4._12_4_ = -(uint)((int)((ulong)fi >> 0x20) == 0);
  iVar1 = movmskps(in_EAX,auVar4);
  if (iVar1 == 0xf) {
    pcVar3 = "Must specify at least one of fe, fi (both NULL).";
    iVar2 = -0x16;
    iVar1 = 0x36;
LAB_001230ee:
    arkProcessError((ARKodeMem)0x0,iVar2,iVar1,"ARKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,pcVar3);
    return (void *)0x0;
  }
  if (y0 == (N_Vector)0x0) {
    pcVar3 = "y0 = NULL illegal.";
    iVar2 = -0x16;
    iVar1 = 0x3e;
    goto LAB_001230ee;
  }
  if (sunctx == (SUNContext_conflict)0x0) {
    pcVar3 = "sunctx = NULL illegal.";
    iVar2 = -0x16;
    iVar1 = 0x45;
    goto LAB_001230ee;
  }
  local_40 = t0;
  local_38 = fe;
  uStack_30 = fi;
  ark_mem_00 = arkCreate(sunctx);
  if (ark_mem_00 == (ARKodeMem)0x0) {
    pcVar3 = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    iVar1 = 0x4e;
    local_48 = (ARKodeMem)0x0;
    goto LAB_001230ee;
  }
  local_48 = ark_mem_00;
  __s = (undefined8 *)malloc(0x200);
  if (__s != (undefined8 *)0x0) {
    memset(__s,0,0x200);
    ark_mem_00->step_attachlinsol = arkStep_AttachLinsol;
    ark_mem_00->step_attachmasssol = arkStep_AttachMasssol;
    ark_mem_00->step_disablelsetup = arkStep_DisableLSetup;
    ark_mem_00->step_disablemsetup = arkStep_DisableMSetup;
    ark_mem_00->step_getlinmem = arkStep_GetLmem;
    ark_mem_00->step_getmassmem = arkStep_GetMassMem;
    ark_mem_00->step_getimplicitrhs = arkStep_GetImplicitRHS;
    ark_mem_00->step_mmult = (ARKMassMultFn)0x0;
    ark_mem_00->step_getgammas = arkStep_GetGammas;
    ark_mem_00->step_init = arkStep_Init;
    ark_mem_00->step_fullrhs = arkStep_FullRHS;
    ark_mem_00->step = arkStep_TakeStep_Z;
    ark_mem_00->step_setuserdata = arkStep_SetUserData;
    ark_mem_00->step_printallstats = arkStep_PrintAllStats;
    ark_mem_00->step_writeparameters = arkStep_WriteParameters;
    ark_mem_00->step_resize = arkStep_Resize;
    ark_mem_00->step_free = arkStep_Free;
    ark_mem_00->step_printmem = arkStep_PrintMem;
    ark_mem_00->step_setdefaults = arkStep_SetDefaults;
    ark_mem_00->step_computestate = arkStep_ComputeState;
    ark_mem_00->step_setrelaxfn = arkStep_SetRelaxFn;
    ark_mem_00->step_setorder = arkStep_SetOrder;
    ark_mem_00->step_setnonlinearsolver = arkStep_SetNonlinearSolver;
    ark_mem_00->step_setlinear = arkStep_SetLinear;
    ark_mem_00->step_setnonlinear = arkStep_SetNonlinear;
    ark_mem_00->step_setautonomous = arkStep_SetAutonomous;
    ark_mem_00->step_setnlsrhsfn = arkStep_SetNlsRhsFn;
    ark_mem_00->step_setdeduceimplicitrhs = arkStep_SetDeduceImplicitRhs;
    ark_mem_00->step_setnonlincrdown = arkStep_SetNonlinCRDown;
    ark_mem_00->step_setnonlinrdiv = arkStep_SetNonlinRDiv;
    ark_mem_00->step_setdeltagammamax = arkStep_SetDeltaGammaMax;
    ark_mem_00->step_setlsetupfrequency = arkStep_SetLSetupFrequency;
    ark_mem_00->step_setpredictormethod = arkStep_SetPredictorMethod;
    ark_mem_00->step_setmaxnonliniters = arkStep_SetMaxNonlinIters;
    ark_mem_00->step_setnonlinconvcoef = arkStep_SetNonlinConvCoef;
    ark_mem_00->step_setstagepredictfn = arkStep_SetStagePredictFn;
    ark_mem_00->step_getnumrhsevals = arkStep_GetNumRhsEvals;
    ark_mem_00->step_getnumlinsolvsetups = arkStep_GetNumLinSolvSetups;
    ark_mem_00->step_getcurrentgamma = arkStep_GetCurrentGamma;
    ark_mem_00->step_getestlocalerrors = arkStep_GetEstLocalErrors;
    ark_mem_00->step_getnonlinearsystemdata = arkStep_GetNonlinearSystemData;
    ark_mem_00->step_getnumnonlinsolviters = arkStep_GetNumNonlinSolvIters;
    ark_mem_00->step_getnumnonlinsolvconvfails = arkStep_GetNumNonlinSolvConvFails;
    ark_mem_00->step_getnonlinsolvstats = arkStep_GetNonlinSolvStats;
    ark_mem_00->step_setforcing = arkStep_SetInnerForcing;
    ark_mem_00->step_supports_adaptive = 1;
    ark_mem_00->step_supports_implicit = 1;
    ark_mem_00->step_supports_massmatrix = 1;
    ark_mem_00->step_supports_relaxation = 1;
    ark_mem_00->step_mem = __s;
    iVar1 = arkStep_SetDefaults(ark_mem_00);
    if (iVar1 != 0) {
      pcVar3 = "Error setting default solver options";
      iVar2 = 0x97;
LAB_00123072:
      arkProcessError(local_48,iVar1,iVar2,"ARKStepCreate",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                      ,pcVar3);
      goto LAB_00123134;
    }
    *(ulong *)((long)__s + 0x1c) =
         ~(CONCAT44(-(uint)((int)uStack_30 == 0),-(uint)((int)local_38 == 0)) &
          CONCAT44(-(uint)(uStack_30._4_4_ == 0),-(uint)(local_38._4_4_ == 0))) &
         (ulong)DAT_00177580;
    iVar1 = arkAllocVec(local_48,y0,(N_Vector *)(__s + 9));
    if (((iVar1 == 0) || (iVar1 = arkAllocVec(local_48,y0,(N_Vector *)(__s + 10)), iVar1 == 0)) ||
       (iVar1 = arkAllocVec(local_48,y0,(N_Vector *)(__s + 0xb)), iVar1 == 0)) goto LAB_00123356;
    *__s = fe;
    __s[1] = fi;
    local_48->lrw = local_48->lrw + 10;
    local_48->liw = local_48->liw + 0x29;
    *(undefined4 *)(__s + 0x12) = 0;
    if (*(int *)(__s + 4) != 0) {
      NLS = SUNNonlinSol_Newton(y0,local_48->sunctx);
      if (NLS == (SUNNonlinearSolver)0x0) {
        pcVar3 = "Error creating default Newton solver";
        iVar1 = 0xc5;
        ark_mem_00 = local_48;
        goto LAB_0012312a;
      }
      iVar1 = ARKodeSetNonlinearSolver(local_48,NLS);
      if (iVar1 != 0) {
        pcVar3 = "Error attaching default Newton solver";
        iVar1 = -0x14;
        iVar2 = 0xcd;
        goto LAB_00123072;
      }
      *(undefined4 *)(__s + 0x12) = 1;
    }
    *(undefined1 (*) [16])(__s + 0x26) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(__s + 0x24) = (undefined1  [16])0x0;
    __s[0x28] = 0;
    *(undefined4 *)(__s + 0x29) = 0xffffffff;
    *(undefined1 (*) [16])(__s + 0x2a) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(__s + 0x2c) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(__s + 0x2e) = (undefined1  [16])0x0;
    __s[0x30] = 0xffffffff00000000;
    __s[0x1d] = 0x3ff0000000000000;
    __s[0x20] = 0;
    __s[0x3c] = 0;
    *(undefined4 *)(__s + 0x3d) = 0;
    __s[0x23] = 0;
    *(undefined1 (*) [16])(__s + 0x31) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(__s + 0x33) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(__s + 0x35) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(__s + 0x37) = (undefined1  [16])0x0;
    *(undefined4 *)(__s + 0x39) = 0;
    iVar1 = arkInit(local_48,local_40,y0,0);
    if (iVar1 == 0) {
      return local_48;
    }
    arkProcessError(local_48,iVar1,0x104,"ARKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Unable to initialize main ARKODE infrastructure");
LAB_00123356:
    ARKodeFree(&local_48);
    return (void *)0x0;
  }
  pcVar3 = "Allocation of arkode_mem failed.";
  iVar1 = 0x58;
LAB_0012312a:
  arkProcessError(ark_mem_00,-0x14,iVar1,"ARKStepCreate",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                  ,pcVar3);
LAB_00123134:
  ARKodeFree(&local_48);
  return (void *)0x0;
}

Assistant:

void* ARKStepCreate(ARKRhsFn fe, ARKRhsFn fi, sunrealtype t0, N_Vector y0,
                    SUNContext sunctx)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  SUNNonlinearSolver NLS;
  int retval;

  /* Check that at least one of fe, fi is supplied and is to be used */
  if (fe == NULL && fi == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (NULL);
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (NULL);
  }

  if (!sunctx)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return (NULL);
  }

  /* Create ark_mem structure and set default values */
  ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (NULL);
  }

  /* Allocate ARKodeARKStepMem structure, and initialize to zero */
  step_mem = NULL;
  step_mem = (ARKodeARKStepMem)malloc(sizeof(struct ARKodeARKStepMemRec));
  if (step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  memset(step_mem, 0, sizeof(struct ARKodeARKStepMemRec));

  /* Attach step_mem structure and function pointers to ark_mem */
  ark_mem->step_attachlinsol              = arkStep_AttachLinsol;
  ark_mem->step_attachmasssol             = arkStep_AttachMasssol;
  ark_mem->step_disablelsetup             = arkStep_DisableLSetup;
  ark_mem->step_disablemsetup             = arkStep_DisableMSetup;
  ark_mem->step_getlinmem                 = arkStep_GetLmem;
  ark_mem->step_getmassmem                = arkStep_GetMassMem;
  ark_mem->step_getimplicitrhs            = arkStep_GetImplicitRHS;
  ark_mem->step_mmult                     = NULL;
  ark_mem->step_getgammas                 = arkStep_GetGammas;
  ark_mem->step_init                      = arkStep_Init;
  ark_mem->step_fullrhs                   = arkStep_FullRHS;
  ark_mem->step                           = arkStep_TakeStep_Z;
  ark_mem->step_setuserdata               = arkStep_SetUserData;
  ark_mem->step_printallstats             = arkStep_PrintAllStats;
  ark_mem->step_writeparameters           = arkStep_WriteParameters;
  ark_mem->step_resize                    = arkStep_Resize;
  ark_mem->step_free                      = arkStep_Free;
  ark_mem->step_printmem                  = arkStep_PrintMem;
  ark_mem->step_setdefaults               = arkStep_SetDefaults;
  ark_mem->step_computestate              = arkStep_ComputeState;
  ark_mem->step_setrelaxfn                = arkStep_SetRelaxFn;
  ark_mem->step_setorder                  = arkStep_SetOrder;
  ark_mem->step_setnonlinearsolver        = arkStep_SetNonlinearSolver;
  ark_mem->step_setlinear                 = arkStep_SetLinear;
  ark_mem->step_setnonlinear              = arkStep_SetNonlinear;
  ark_mem->step_setautonomous             = arkStep_SetAutonomous;
  ark_mem->step_setnlsrhsfn               = arkStep_SetNlsRhsFn;
  ark_mem->step_setdeduceimplicitrhs      = arkStep_SetDeduceImplicitRhs;
  ark_mem->step_setnonlincrdown           = arkStep_SetNonlinCRDown;
  ark_mem->step_setnonlinrdiv             = arkStep_SetNonlinRDiv;
  ark_mem->step_setdeltagammamax          = arkStep_SetDeltaGammaMax;
  ark_mem->step_setlsetupfrequency        = arkStep_SetLSetupFrequency;
  ark_mem->step_setpredictormethod        = arkStep_SetPredictorMethod;
  ark_mem->step_setmaxnonliniters         = arkStep_SetMaxNonlinIters;
  ark_mem->step_setnonlinconvcoef         = arkStep_SetNonlinConvCoef;
  ark_mem->step_setstagepredictfn         = arkStep_SetStagePredictFn;
  ark_mem->step_getnumrhsevals            = arkStep_GetNumRhsEvals;
  ark_mem->step_getnumlinsolvsetups       = arkStep_GetNumLinSolvSetups;
  ark_mem->step_getcurrentgamma           = arkStep_GetCurrentGamma;
  ark_mem->step_getestlocalerrors         = arkStep_GetEstLocalErrors;
  ark_mem->step_getnonlinearsystemdata    = arkStep_GetNonlinearSystemData;
  ark_mem->step_getnumnonlinsolviters     = arkStep_GetNumNonlinSolvIters;
  ark_mem->step_getnumnonlinsolvconvfails = arkStep_GetNumNonlinSolvConvFails;
  ark_mem->step_getnonlinsolvstats        = arkStep_GetNonlinSolvStats;
  ark_mem->step_setforcing                = arkStep_SetInnerForcing;
  ark_mem->step_supports_adaptive         = SUNTRUE;
  ark_mem->step_supports_implicit         = SUNTRUE;
  ark_mem->step_supports_massmatrix       = SUNTRUE;
  ark_mem->step_supports_relaxation       = SUNTRUE;
  ark_mem->step_mem                       = (void*)step_mem;

  /* Set default values for optional inputs */
  retval = arkStep_SetDefaults((void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit = (fe == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit = (fi == NULL) ? SUNFALSE : SUNTRUE;

  /* Allocate the general ARK stepper vectors using y0 as a template */
  /* NOTE: Fe, Fi, cvals and Xvecs will be allocated later on
     (based on the number of ARK stages) */

  /* Clone the input vector to create sdata, zpred and zcor */
  if (!arkAllocVec(ark_mem, y0, &(step_mem->sdata)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  if (!arkAllocVec(ark_mem, y0, &(step_mem->zpred)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  if (!arkAllocVec(ark_mem, y0, &(step_mem->zcor)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->fe = fe;
  step_mem->fi = fi;

  /* Update the ARKODE workspace requirements */
  ark_mem->liw += 41; /* fcn/data ptr, int, long int, sunindextype, sunbooleantype */
  ark_mem->lrw += 10;

  /* If an implicit component is to be solved, create default Newton NLS object */
  step_mem->ownNLS = SUNFALSE;
  if (step_mem->implicit)
  {
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error creating default Newton solver");
      ARKodeFree((void**)&ark_mem);
      return (NULL);
    }
    retval = ARKodeSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error attaching default Newton solver");
      ARKodeFree((void**)&ark_mem);
      return (NULL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* Set the linear solver addresses to NULL (we check != NULL later) */
  step_mem->linit       = NULL;
  step_mem->lsetup      = NULL;
  step_mem->lsolve      = NULL;
  step_mem->lfree       = NULL;
  step_mem->lmem        = NULL;
  step_mem->lsolve_type = -1;

  /* Set the mass matrix solver addresses to NULL */
  step_mem->minit       = NULL;
  step_mem->msetup      = NULL;
  step_mem->mmult       = NULL;
  step_mem->msolve      = NULL;
  step_mem->mfree       = NULL;
  step_mem->mass_mem    = NULL;
  step_mem->mass_type   = MASS_IDENTITY;
  step_mem->msolve_type = -1;

  /* Initialize initial error norm  */
  step_mem->eRNrm = ONE;

  /* Initialize all the counters */
  step_mem->nfe       = 0;
  step_mem->nfi       = 0;
  step_mem->nsetups   = 0;
  step_mem->nstlp     = 0;
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* Initialize fused op work space */
  step_mem->cvals        = NULL;
  step_mem->Xvecs        = NULL;
  step_mem->nfusedopvecs = 0;

  /* Initialize external polynomial forcing data */
  step_mem->expforcing = SUNFALSE;
  step_mem->impforcing = SUNFALSE;
  step_mem->forcing    = NULL;
  step_mem->nforcing   = 0;

  /* Initialize saved fi alias */
  step_mem->fn_implicit = NULL;

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  return ((void*)ark_mem);
}